

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.cpp
# Opt level: O2

void __thiscall
TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
          (ParticleSwarmState *this,double *box_lower,double *box_upper,
          function<double_()> *get_random01)

{
  uint uVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  for (uVar3 = 0; (long)uVar3 < (long)this->num_particles * (long)this->num_dimensions;
      uVar3 = uVar3 + 1) {
    uVar1 = (int)uVar3 >> 0x1f;
    uVar2 = (long)((ulong)uVar1 << 0x20 | uVar3 & 0xffffffff) % (long)this->num_dimensions &
            0xffffffff;
    dVar4 = ABS(box_upper[uVar2] - box_lower[uVar2]);
    dVar5 = std::function<double_()>::operator()(get_random01);
    (this->particle_positions).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] =
         dVar5 * dVar4 +
         box_lower[(long)((ulong)uVar1 << 0x20 | uVar3 & 0xffffffff) % (long)this->num_dimensions &
                   0xffffffff];
    dVar5 = std::function<double_()>::operator()(get_random01);
    (this->particle_velocities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] = dVar5 * (dVar4 + dVar4) - dVar4;
  }
  this->positions_initialized = true;
  this->velocities_initialized = true;
  return;
}

Assistant:

void ParticleSwarmState::initializeParticlesInsideBox(const double box_lower[], const double box_upper[],
                                                      const std::function<double(void)> get_random01) {
    for (int i=0; i<num_particles * num_dimensions; i++) {
        double range = std::fabs(box_upper[i % num_dimensions] - box_lower[i % num_dimensions]);
        particle_positions[i] = range * get_random01() + box_lower[i % num_dimensions];
        particle_velocities[i] = 2 * range * get_random01() - range;
    }
    positions_initialized = true;
    velocities_initialized = true;
}